

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_hmi_midiout.cpp
# Opt level: O3

void __thiscall HMISong::AdvanceTracks(HMISong *this,DWORD time)

{
  int *piVar1;
  uint uVar2;
  TrackInfo *pTVar3;
  long lVar4;
  
  uVar2 = this->NumTracks;
  if (-1 < (int)uVar2) {
    pTVar3 = this->Tracks;
    lVar4 = 0;
    do {
      if ((*(char *)((long)pTVar3->Designation + lVar4 + 0x10) == '\x01') &&
         (*(char *)((long)pTVar3->Designation + lVar4 + 0x11) == '\0')) {
        piVar1 = (int *)((long)pTVar3->Designation + lVar4 + -8);
        *piVar1 = *piVar1 - time;
        piVar1 = (int *)((long)pTVar3->Designation + lVar4 + -4);
        *piVar1 = *piVar1 + time;
      }
      lVar4 = lVar4 + 0x38;
    } while ((ulong)uVar2 * 0x38 + 0x38 != lVar4);
  }
  NoteOffQueue::AdvanceTime(&this->NoteOffs,time);
  return;
}

Assistant:

void HMISong::AdvanceTracks(DWORD time)
{
	for (int i = 0; i <= NumTracks; ++i)
	{
		if (Tracks[i].Enabled && !Tracks[i].Finished)
		{
			Tracks[i].Delay -= time;
			Tracks[i].PlayedTime += time;
		}
	}
	NoteOffs.AdvanceTime(time);
}